

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_analyze.hpp
# Opt level: O2

bool duckdb::AlpAnalyze<double>(AnalyzeState *state,Vector *input,idx_t count)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  idx_t i;
  size_type sVar6;
  idx_t i_2;
  ulong uVar7;
  size_type nulls_count;
  ulong __n;
  AlpSamplingParameters AVar8;
  allocator_type local_d9;
  value_type local_d8;
  vector<double,_true> current_vector_values;
  vector<double,_true> current_vector_sample;
  value_type_conflict8 local_98;
  vector<unsigned_short,_true> current_vector_null_positions;
  UnifiedVectorFormat vdata;
  
  pp_Var1 = state[3]._vptr_AnalyzeState;
  if ((ulong)pp_Var1 % 7 == 0) {
    pp_Var2 = state[2]._vptr_AnalyzeState;
    state[2].info.block_manager =
         (BlockManager *)((long)&(state[2].info.block_manager)->_vptr_BlockManager + count);
    state[3]._vptr_AnalyzeState = (_func_int **)((long)pp_Var1 + 1);
    if ((0x1f < count) || (pp_Var2 == (_func_int **)0x0)) {
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      Vector::ToUnifiedFormat(input,count,&vdata);
      AVar8 = alp::AlpUtils::GetSamplingParameters(count);
      __n = AVar8._0_8_ & 0xffffffff;
      current_vector_values.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
      _0_2_ = 0;
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&current_vector_null_positions.
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,__n,
                 (value_type_conflict7 *)&current_vector_values,
                 (allocator_type *)&current_vector_sample);
      current_vector_sample.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      ::std::vector<double,_std::allocator<double>_>::vector
                (&current_vector_values.super_vector<double,_std::allocator<double>_>,__n,
                 (value_type_conflict8 *)&current_vector_sample,(allocator_type *)&local_98);
      local_98 = 0.0;
      ::std::vector<double,_std::allocator<double>_>::vector
                (&current_vector_sample.super_vector<double,_std::allocator<double>_>,
                 (ulong)AVar8.n_sampled_values,&local_98,&local_d9);
      if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (sVar6 = 0; __n != sVar6; sVar6 = sVar6 + 1) {
          sVar3 = sVar6;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            sVar3 = (size_type)(vdata.sel)->sel_vector[sVar6];
          }
          local_d8 = *(value_type *)(vdata.data + sVar3 * 8);
          pvVar5 = vector<double,_true>::get<true>(&current_vector_values,sVar6);
          *pvVar5 = local_d8;
        }
      }
      else {
        nulls_count = 0;
        for (sVar6 = 0; __n != sVar6; sVar6 = sVar6 + 1) {
          sVar3 = sVar6;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            sVar3 = (size_type)(vdata.sel)->sel_vector[sVar6];
          }
          if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                             [sVar3 >> 6] >> (sVar3 & 0x3f) & 1) == 0);
          }
          local_d8 = *(value_type *)(vdata.data + sVar3 * 8);
          pvVar4 = vector<unsigned_short,_true>::get<true>
                             (&current_vector_null_positions,nulls_count);
          *pvVar4 = (value_type)sVar6;
          pvVar5 = vector<double,_true>::get<true>(&current_vector_values,sVar6);
          nulls_count = nulls_count + uVar7;
          *pvVar5 = local_d8;
        }
        alp::AlpUtils::FindAndReplaceNullsInVector<double>
                  ((double *)
                   CONCAT62(current_vector_values.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._2_6_,
                            current_vector_values.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_2_),
                   current_vector_null_positions.
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start,__n,nulls_count);
      }
      sVar6 = 0;
      for (uVar7 = 0; uVar7 < __n; uVar7 = uVar7 + (AVar8._0_8_ >> 0x20)) {
        pvVar5 = vector<double,_true>::get<true>(&current_vector_values,uVar7);
        local_d8 = *pvVar5;
        pvVar5 = vector<double,_true>::get<true>(&current_vector_sample,sVar6);
        *pvVar5 = local_d8;
        sVar6 = sVar6 + 1;
      }
      ::std::vector<duckdb::vector<double,true>,std::allocator<duckdb::vector<double,true>>>::
      emplace_back<duckdb::vector<double,true>>
                ((vector<duckdb::vector<double,true>,std::allocator<duckdb::vector<double,true>>> *)
                 (state + 5),&current_vector_values);
      ::std::vector<duckdb::vector<double,true>,std::allocator<duckdb::vector<double,true>>>::
      emplace_back<duckdb::vector<double,true>>
                ((vector<duckdb::vector<double,true>,std::allocator<duckdb::vector<double,true>>> *)
                 &state[3].info,&current_vector_sample);
      state[2]._vptr_AnalyzeState = (_func_int **)((long)state[2]._vptr_AnalyzeState + 1);
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&current_vector_sample);
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&current_vector_values);
      ::std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)
                 &current_vector_null_positions);
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
  }
  else {
    state[3]._vptr_AnalyzeState = (_func_int **)((long)pp_Var1 + 1);
    state[2].info.block_manager =
         (BlockManager *)((long)&(state[2].info.block_manager)->_vptr_BlockManager + count);
  }
  return true;
}

Assistant:

bool AlpAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &analyze_state = (AlpAnalyzeState<T> &)state;
	bool must_skip_current_vector = alp::AlpUtils::MustSkipSamplingFromCurrentVector(
	    analyze_state.vectors_count, analyze_state.vectors_sampled_count, count);
	analyze_state.vectors_count += 1;
	analyze_state.total_values_count += count;
	if (must_skip_current_vector) {
		return true;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<T>(vdata);

	alp::AlpSamplingParameters sampling_params = alp::AlpUtils::GetSamplingParameters(count);

	vector<uint16_t> current_vector_null_positions(sampling_params.n_lookup_values, 0);
	vector<T> current_vector_values(sampling_params.n_lookup_values, 0);
	vector<T> current_vector_sample(sampling_params.n_sampled_values, 0);

	// Storing the entire sampled vector
	//! We need to store the entire sampled vector to perform the 'analyze' compression in it
	idx_t nulls_idx = 0;
	// We optimize by doing a different loop when there are no nulls
	if (vdata.validity.AllValid()) {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i++) {
			auto idx = vdata.sel->get_index(i);
			T value = data[idx];
			current_vector_values[i] = value;
		}
	} else {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i++) {
			auto idx = vdata.sel->get_index(i);
			T value = data[idx];
			//! We resolve null values with a predicated comparison
			bool is_null = !vdata.validity.RowIsValid(idx);
			current_vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(i);
			nulls_idx += is_null;
			current_vector_values[i] = value;
		}
		alp::AlpUtils::FindAndReplaceNullsInVector<T>(current_vector_values.data(),
		                                              current_vector_null_positions.data(),
		                                              sampling_params.n_lookup_values, nulls_idx);
	}

	// Storing the sample of that vector
	idx_t sample_idx = 0;
	for (idx_t i = 0; i < sampling_params.n_lookup_values; i += sampling_params.n_sampled_increments) {
		current_vector_sample[sample_idx] = current_vector_values[i];
		sample_idx++;
	}
	D_ASSERT(sample_idx == sampling_params.n_sampled_values);

	//! A std::move is needed to avoid a copy of the pushed vector
	analyze_state.complete_vectors_sampled.push_back(std::move(current_vector_values));
	analyze_state.rowgroup_sample.push_back(std::move(current_vector_sample));
	analyze_state.vectors_sampled_count++;
	return true;
}